

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

bool __thiscall Analyser::Static::Commodore::File::is_basic(File *this)

{
  ushort uVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  uint uVar8;
  pointer puVar9;
  
  if (this->type != RelocatableProgram) {
    return false;
  }
  uVar5 = (uint)this->starting_address;
  puVar2 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0xffffffff;
  do {
    puVar9 = (pointer)(long)(int)(uVar5 - this->starting_address);
    if (puVar2 + (2 - (long)puVar3) <= puVar9) goto LAB_001624d3;
    uVar1 = *(ushort *)(puVar9 + (long)puVar3);
    if (uVar1 == 0) {
      cVar7 = '\x01';
    }
    else {
      cVar7 = '\x03';
      if ((puVar9 < puVar2 + (5 - (long)puVar3)) && (uVar5 + 5 <= (uint)uVar1)) {
        uVar8 = (uint)*(ushort *)(puVar9 + (long)(puVar3 + 2));
        if ((int)uVar6 < (int)uVar8) {
          uVar5 = (uint)uVar1;
        }
        bVar4 = (int)uVar8 <= (int)uVar6;
        if ((int)uVar6 < (int)uVar8) {
          uVar6 = uVar8;
        }
        cVar7 = bVar4 * '\x03';
      }
    }
  } while (cVar7 == '\0');
  if (cVar7 == '\x03') {
LAB_001624d3:
    bVar4 = false;
  }
  else {
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool Analyser::Static::Commodore::File::is_basic() {
	// BASIC files are always relocatable (?)
	if(type != File::RelocatableProgram) return false;

	uint16_t line_address = starting_address;
	int line_number = -1;

	// decide whether this is a BASIC file based on the proposition that:
	//	(1) they're always relocatable; and
	//	(2) they have a per-line structure of:
	//		[4 bytes: address of start of next line]
	//		[4 bytes: this line number]
	//		... null-terminated code ...
	//	(with a next line address of 0000 indicating end of program)
	while(1) {
		if(size_t(line_address - starting_address) >= data.size() + 2) break;

		uint16_t next_line_address = data[line_address - starting_address];
		next_line_address |= data[line_address - starting_address + 1] << 8;

		if(!next_line_address) {
			return true;
		}
		if(next_line_address < line_address + 5) break;

		if(size_t(line_address - starting_address) >= data.size() + 5) break;
		uint16_t next_line_number = data[line_address - starting_address + 2];
		next_line_number |= data[line_address - starting_address + 3] << 8;

		if(next_line_number <= line_number) break;

		line_number = uint16_t(next_line_number);
		line_address = next_line_address;
	}

	return false;
}